

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.c
# Opt level: O2

void convert_error(quicly_stream_t *stream,int err)

{
  uint uVar1;
  ulong uVar2;
  int err_00;
  
  if ((err & 0xffff0000U) != 0x30000) {
    err_00 = 0x20001;
    if ((err & 0xffff0000U) == 0x20000) {
      err_00 = err;
    }
    quicly_close(stream->conn,err_00,(char *)0x0);
    return;
  }
  uVar2 = stream->stream_id & 0x8000000000000002;
  uVar1 = ((uint)stream->stream_id ^ (uint)(stream->conn->super).local.bidi.next_stream_id) & 1;
  if ((uVar2 != 2) || (uVar1 == 0)) {
    if ((stream->sendstate).final_size == 0xffffffffffffffff) {
      quicly_reset_stream(stream,err);
      uVar2 = stream->stream_id & 0x8000000000000002;
      uVar1 = ((uint)stream->stream_id ^ (uint)(stream->conn->super).local.bidi.next_stream_id) & 1;
    }
    if ((uVar2 == 2) && (uVar1 == 0)) {
      return;
    }
  }
  quicly_request_stop(stream,err);
  return;
}

Assistant:

static void convert_error(quicly_stream_t *stream, int err)
{
    assert(err != 0);
    if (QUICLY_ERROR_IS_QUIC_APPLICATION(err)) {
        if (quicly_stream_has_send_side(quicly_is_client(stream->conn), stream->stream_id) &&
            quicly_sendstate_is_open(&stream->sendstate))
            quicly_reset_stream(stream, err);
        if (quicly_stream_has_receive_side(quicly_is_client(stream->conn), stream->stream_id))
            quicly_request_stop(stream, err);
    } else {
        quicly_close(stream->conn, QUICLY_ERROR_IS_QUIC_TRANSPORT(err) ? err : QUICLY_TRANSPORT_ERROR_INTERNAL, NULL);
    }
}